

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

bool amrex::VisMF::Exist(string *mf_name)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  ifstream iss;
  int exist;
  string FullHdrFileName;
  char local_238 [24];
  char *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  uint local_2c;
  string local_28 [40];
  
  std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  local_2c = 0;
  bVar1 = ParallelDescriptor::IOProcessor();
  if (bVar1) {
    std::ifstream::ifstream(local_238);
    _Var3 = std::__cxx11::string::c_str();
    std::ifstream::open(local_238,_Var3);
    bVar2 = std::ios::good();
    local_2c = (uint)(bVar2 & 1);
    std::ifstream::~ifstream(local_238);
  }
  iVar4 = ParallelDescriptor::IOProcessorNumber();
  ParallelDescriptor::Bcast<int>((int *)&local_2c,1,iVar4);
  bVar1 = local_2c != 0;
  std::__cxx11::string::~string(local_28);
  return bVar1;
}

Assistant:

bool
VisMF::Exist (const std::string& mf_name)
{
    std::string FullHdrFileName(mf_name + TheMultiFabHdrFileSuffix);
    int exist = 0;
    if (ParallelDescriptor::IOProcessor()) {
        std::ifstream iss;
        iss.open(FullHdrFileName.c_str(), std::ios::in);
        exist = iss.good();
    }
    ParallelDescriptor::Bcast(&exist, 1, ParallelDescriptor::IOProcessorNumber());
    return exist;
}